

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

int __thiscall
pbrt::PtexTextureBase::SampleTexture(PtexTextureBase *this,TextureEvalContext ctx,float *result)

{
  float *pfVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  ulong uVar16;
  undefined8 uVar17;
  byte bVar18;
  byte bVar19;
  char cVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  int iVar30;
  FilterType FVar31;
  int iVar32;
  float fVar33;
  uint uVar34;
  PtexTexture *tex;
  PtexFilter *pPVar35;
  ulong uVar36;
  ulong uVar37;
  long in_FS_OFFSET;
  ushort uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  span<const_unsigned_char> vin;
  span<const_unsigned_char> vin_00;
  span<float> vout;
  span<float> vout_00;
  uint8_t result8 [3];
  byte local_77 [3];
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 uStack_68;
  uint auStack_60 [2];
  undefined1 uStack_58;
  undefined7 uStack_57;
  uint auStack_50 [3];
  Options OStack_44;
  
  if (this->valid == false) {
    *result = 0.0;
    uVar34 = 1;
  }
  else {
    *(long *)(in_FS_OFFSET + -0x5b0) = *(long *)(in_FS_OFFSET + -0x5b0) + 1;
    auStack_60[0] = 0;
    auStack_60[1] = 0;
    uStack_58 = 0;
    uStack_68 = &uStack_58;
    tex = (PtexTexture *)
          (**(code **)(*cache + 0x28))(cache,(this->filename)._M_dataplus._M_p,&uStack_68);
    if (tex == (PtexTexture *)0x0) {
      LogFatal<char_const(&)[19]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/textures.cpp"
                 ,0x295,"Check failed: %s",(char (*) [19])"texture != nullptr");
    }
    OStack_44.__structSize = 0x14;
    OStack_44.filter = f_bspline;
    OStack_44.lerp = false;
    OStack_44.sharpness = 0.0;
    OStack_44.noedgeblend = false;
    pPVar35 = Ptex::v2_2::PtexFilter::getFilter(tex,&OStack_44);
    uVar34 = (*tex->_vptr_PtexTexture[0xb])(tex);
    (*pPVar35->_vptr_PtexFilter[3])
              ((ulong)(uint)ctx.uv.super_Tuple2<pbrt::Point2,_float>.x,
               (ulong)(uint)ctx.uv.super_Tuple2<pbrt::Point2,_float>.y,(ulong)(uint)ctx.dudx,
               (ulong)(uint)ctx.dvdx,(ulong)(uint)ctx.dudy,(ulong)(uint)ctx.dvdy,
               SUB648(ZEXT464(0x3f800000),0),0,pPVar35,result,0,(ulong)uVar34,
               (ulong)(uint)ctx.faceIndex);
    (*pPVar35->_vptr_PtexFilter[2])(pPVar35);
    (*tex->_vptr_PtexTexture[2])(tex);
    uVar36 = (this->encoding).
             super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             .bits;
    if (uVar36 != ColorEncodingHandle::Linear) {
      if (0 < (int)uVar34) {
        auVar41 = vpbroadcastq_avx512f();
        uVar37 = 0;
        auVar42 = vbroadcastss_avx512f(ZEXT416(0x437f0000));
        auVar43 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar44 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar45 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
        do {
          auVar46 = vpbroadcastq_avx512f();
          auVar47 = vporq_avx512f(auVar46,auVar43);
          auVar46 = vporq_avx512f(auVar46,auVar44);
          uVar17 = vpcmpuq_avx512f(auVar46,auVar41,2);
          bVar18 = (byte)uVar17;
          uVar17 = vpcmpuq_avx512f(auVar47,auVar41,2);
          bVar19 = (byte)uVar17;
          uVar38 = CONCAT11(bVar19,bVar18);
          pfVar1 = result + uVar37;
          auVar46._4_4_ = (uint)((byte)(uVar38 >> 1) & 1) * (int)pfVar1[1];
          auVar46._0_4_ = (uint)(bVar18 & 1) * (int)*pfVar1;
          auVar46._8_4_ = (uint)((byte)(uVar38 >> 2) & 1) * (int)pfVar1[2];
          auVar46._12_4_ = (uint)((byte)(uVar38 >> 3) & 1) * (int)pfVar1[3];
          auVar46._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * (int)pfVar1[4];
          auVar46._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * (int)pfVar1[5];
          auVar46._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * (int)pfVar1[6];
          auVar46._28_4_ = (uint)((byte)(uVar38 >> 7) & 1) * (int)pfVar1[7];
          auVar46._32_4_ = (uint)(bVar19 & 1) * (int)pfVar1[8];
          auVar46._36_4_ = (uint)(bVar19 >> 1 & 1) * (int)pfVar1[9];
          auVar46._40_4_ = (uint)(bVar19 >> 2 & 1) * (int)pfVar1[10];
          auVar46._44_4_ = (uint)(bVar19 >> 3 & 1) * (int)pfVar1[0xb];
          auVar46._48_4_ = (uint)(bVar19 >> 4 & 1) * (int)pfVar1[0xc];
          auVar46._52_4_ = (uint)(bVar19 >> 5 & 1) * (int)pfVar1[0xd];
          auVar46._56_4_ = (uint)(bVar19 >> 6 & 1) * (int)pfVar1[0xe];
          auVar46._60_4_ = (uint)(bVar19 >> 7) * (int)pfVar1[0xf];
          auVar46 = vfmadd213ps_avx512f(auVar46,auVar42,auVar45);
          uVar16 = vcmpps_avx512f(auVar46,ZEXT1664(ZEXT816(0) << 0x40),5);
          auVar46 = vminps_avx512f(auVar42,auVar46);
          auVar47._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar46._4_4_;
          auVar47._0_4_ = (uint)((byte)uVar16 & 1) * auVar46._0_4_;
          auVar47._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar46._8_4_;
          auVar47._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar46._12_4_;
          auVar47._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar46._16_4_;
          auVar47._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar46._20_4_;
          auVar47._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar46._24_4_;
          auVar47._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar46._28_4_;
          auVar47._32_4_ = (uint)((byte)(uVar16 >> 8) & 1) * auVar46._32_4_;
          auVar47._36_4_ = (uint)((byte)(uVar16 >> 9) & 1) * auVar46._36_4_;
          auVar47._40_4_ = (uint)((byte)(uVar16 >> 10) & 1) * auVar46._40_4_;
          auVar47._44_4_ = (uint)((byte)(uVar16 >> 0xb) & 1) * auVar46._44_4_;
          auVar47._48_4_ = (uint)((byte)(uVar16 >> 0xc) & 1) * auVar46._48_4_;
          auVar47._52_4_ = (uint)((byte)(uVar16 >> 0xd) & 1) * auVar46._52_4_;
          auVar47._56_4_ = (uint)((byte)(uVar16 >> 0xe) & 1) * auVar46._56_4_;
          auVar47._60_4_ = (uint)(byte)(uVar16 >> 0xf) * auVar46._60_4_;
          auVar46 = vcvttps2dq_avx512f(auVar47);
          auVar39 = vpmovdb_avx512f(auVar46);
          cVar20 = *(char *)((long)&uStack_68 + uVar37);
          bVar3 = (bool)((byte)(uVar38 >> 1) & 1);
          bVar4 = (bool)((byte)(uVar38 >> 2) & 1);
          bVar5 = (bool)((byte)(uVar38 >> 3) & 1);
          bVar6 = (bool)((byte)(uVar38 >> 4) & 1);
          bVar7 = (bool)((byte)(uVar38 >> 5) & 1);
          bVar8 = (bool)((byte)(uVar38 >> 6) & 1);
          bVar9 = (bool)((byte)(uVar38 >> 7) & 1);
          bVar10 = (bool)(bVar19 >> 1 & 1);
          bVar11 = (bool)(bVar19 >> 2 & 1);
          bVar12 = (bool)(bVar19 >> 3 & 1);
          bVar13 = (bool)(bVar19 >> 4 & 1);
          bVar14 = (bool)(bVar19 >> 5 & 1);
          bVar15 = (bool)(bVar19 >> 6 & 1);
          local_77[uVar37] = (bVar18 & 1) * auVar39[0] | !(bool)(bVar18 & 1) * local_77[uVar37];
          local_77[uVar37 + 1] = bVar3 * auVar39[1] | !bVar3 * local_77[uVar37 + 1];
          local_77[uVar37 + 2] = bVar4 * auVar39[2] | !bVar4 * local_77[uVar37 + 2];
          local_77[uVar37 + 3] = bVar5 * auVar39[3] | !bVar5 * local_77[uVar37 + 3];
          local_77[uVar37 + 4] = bVar6 * auVar39[4] | !bVar6 * local_77[uVar37 + 4];
          local_77[uVar37 + 5] = bVar7 * auVar39[5] | !bVar7 * local_77[uVar37 + 5];
          local_77[uVar37 + 6] = bVar8 * auVar39[6] | !bVar8 * local_77[uVar37 + 6];
          local_77[uVar37 + 7] = bVar9 * auVar39[7] | !bVar9 * local_77[uVar37 + 7];
          local_77[uVar37 + 8] =
               (bVar19 & 1) * auVar39[8] | !(bool)(bVar19 & 1) * local_77[uVar37 + 8];
          local_77[uVar37 + 9] = bVar10 * auVar39[9] | !bVar10 * local_77[uVar37 + 9];
          local_77[uVar37 + 10] = bVar11 * auVar39[10] | !bVar11 * local_77[uVar37 + 10];
          local_77[uVar37 + 0xb] = bVar12 * auVar39[0xb] | !bVar12 * local_77[uVar37 + 0xb];
          local_77[uVar37 + 0xc] = bVar13 * auVar39[0xc] | !bVar13 * local_77[uVar37 + 0xc];
          local_77[uVar37 + 0xd] = bVar14 * auVar39[0xd] | !bVar14 * local_77[uVar37 + 0xd];
          local_77[uVar37 + 0xe] = bVar15 * auVar39[0xe] | !bVar15 * local_77[uVar37 + 0xe];
          *(char *)((long)&uStack_68 + uVar37) =
               -((char)bVar19 >> 7) * auVar39[0xf] | !(bool)-((char)bVar19 >> 7) * cVar20;
          uVar37 = uVar37 + 0x10;
        } while ((uVar34 + 0xf & 0xfffffff0) != uVar37);
      }
      vin.n = (size_t)(int)uVar34;
      if (uVar36 >> 0x31 == 0) {
        if (uVar34 != 0) {
          auVar41 = vpbroadcastq_avx512f();
          uVar36 = 0;
          auVar42 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar43 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar44 = vbroadcastss_avx512f(ZEXT416(0x437f0000));
          do {
            auVar45 = vpbroadcastq_avx512f();
            auVar46 = vporq_avx512f(auVar45,auVar42);
            auVar45 = vporq_avx512f(auVar45,auVar43);
            uVar17 = vpcmpuq_avx512f(auVar45,auVar41,2);
            bVar18 = (byte)uVar17;
            uVar17 = vpcmpuq_avx512f(auVar46,auVar41,2);
            bVar19 = (byte)uVar17;
            uVar38 = CONCAT11(bVar19,bVar18);
            auVar39 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(local_77 + uVar36));
            auVar40[1] = ((byte)(uVar38 >> 1) & 1) * auVar39[1];
            auVar40[0] = (bVar18 & 1) * auVar39[0];
            auVar40[2] = ((byte)(uVar38 >> 2) & 1) * auVar39[2];
            auVar40[3] = ((byte)(uVar38 >> 3) & 1) * auVar39[3];
            auVar40[4] = ((byte)(uVar38 >> 4) & 1) * auVar39[4];
            auVar40[5] = ((byte)(uVar38 >> 5) & 1) * auVar39[5];
            auVar40[6] = ((byte)(uVar38 >> 6) & 1) * auVar39[6];
            auVar40[7] = ((byte)(uVar38 >> 7) & 1) * auVar39[7];
            auVar40[8] = (bVar19 & 1) * auVar39[8];
            auVar40[9] = (bVar19 >> 1 & 1) * auVar39[9];
            auVar40[10] = (bVar19 >> 2 & 1) * auVar39[10];
            auVar40[0xb] = (bVar19 >> 3 & 1) * auVar39[0xb];
            auVar40[0xc] = (bVar19 >> 4 & 1) * auVar39[0xc];
            auVar40[0xd] = (bVar19 >> 5 & 1) * auVar39[0xd];
            auVar40[0xe] = (bVar19 >> 6 & 1) * auVar39[0xe];
            auVar40[0xf] = -((char)bVar19 >> 7) * auVar39[0xf];
            auVar45 = vpmovzxbd_avx512f(auVar40);
            auVar45 = vcvtdq2ps_avx512f(auVar45);
            auVar45 = vdivps_avx512f(auVar45,auVar44);
            lVar2 = uVar36 * 4;
            iVar21 = *(int *)((long)&uStack_68 + lVar2);
            iVar22 = *(int *)((long)&uStack_68 + lVar2 + 4);
            uVar23 = auStack_60[uVar36];
            uVar24 = auStack_60[uVar36 + 1];
            uVar25 = auStack_50[uVar36 - 2];
            uVar26 = auStack_50[uVar36 - 1];
            uVar27 = auStack_50[uVar36];
            uVar28 = auStack_50[uVar36 + 1];
            uVar29 = auStack_50[uVar36 + 2];
            iVar30 = (&OStack_44.__structSize)[uVar36];
            FVar31 = (&OStack_44.filter)[uVar36];
            iVar32 = *(int *)(&OStack_44.lerp + lVar2);
            fVar33 = (&OStack_44.sharpness)[uVar36];
            bVar3 = (bool)((byte)(uVar38 >> 1) & 1);
            bVar4 = (bool)((byte)(uVar38 >> 2) & 1);
            bVar5 = (bool)((byte)(uVar38 >> 3) & 1);
            bVar6 = (bool)((byte)(uVar38 >> 4) & 1);
            bVar7 = (bool)((byte)(uVar38 >> 5) & 1);
            bVar8 = (bool)((byte)(uVar38 >> 6) & 1);
            bVar9 = (bool)((byte)(uVar38 >> 7) & 1);
            bVar10 = (bool)(bVar19 >> 1 & 1);
            bVar11 = (bool)(bVar19 >> 2 & 1);
            bVar12 = (bool)(bVar19 >> 3 & 1);
            bVar13 = (bool)(bVar19 >> 4 & 1);
            bVar14 = (bool)(bVar19 >> 5 & 1);
            bVar15 = (bool)(bVar19 >> 6 & 1);
            *(uint *)(local_77 + lVar2 + 3) =
                 (uint)(bVar18 & 1) * auVar45._0_4_ |
                 (uint)!(bool)(bVar18 & 1) * *(uint *)(local_77 + lVar2 + 3);
            *(uint *)(local_77 + lVar2 + 7) =
                 (uint)bVar3 * auVar45._4_4_ | (uint)!bVar3 * *(int *)(local_77 + lVar2 + 7);
            *(uint *)(local_77 + lVar2 + 0xb) =
                 (uint)bVar4 * auVar45._8_4_ | (uint)!bVar4 * *(int *)(local_77 + lVar2 + 0xb);
            *(uint *)((long)&uStack_68 + lVar2) =
                 (uint)bVar5 * auVar45._12_4_ | (uint)!bVar5 * iVar21;
            *(uint *)((long)&uStack_68 + lVar2 + 4) =
                 (uint)bVar6 * auVar45._16_4_ | (uint)!bVar6 * iVar22;
            auStack_60[uVar36] = (uint)bVar7 * auVar45._20_4_ | !bVar7 * uVar23;
            auStack_60[uVar36 + 1] = (uint)bVar8 * auVar45._24_4_ | !bVar8 * uVar24;
            auStack_50[uVar36 - 2] = (uint)bVar9 * auVar45._28_4_ | !bVar9 * uVar25;
            auStack_50[uVar36 - 1] =
                 (uint)(bVar19 & 1) * auVar45._32_4_ | !(bool)(bVar19 & 1) * uVar26;
            auStack_50[uVar36] = (uint)bVar10 * auVar45._36_4_ | !bVar10 * uVar27;
            auStack_50[uVar36 + 1] = (uint)bVar11 * auVar45._40_4_ | !bVar11 * uVar28;
            auStack_50[uVar36 + 2] = (uint)bVar12 * auVar45._44_4_ | !bVar12 * uVar29;
            (&OStack_44.__structSize)[uVar36] =
                 (uint)bVar13 * auVar45._48_4_ | (uint)!bVar13 * iVar30;
            (&OStack_44.filter)[uVar36] = (uint)bVar14 * auVar45._52_4_ | !bVar14 * FVar31;
            *(uint *)(&OStack_44.lerp + lVar2) =
                 (uint)bVar15 * auVar45._56_4_ | (uint)!bVar15 * iVar32;
            (&OStack_44.sharpness)[uVar36] =
                 (float)((uint)(bVar19 >> 7) * auVar45._60_4_ |
                        (uint)!(bool)(bVar19 >> 7) * (int)fVar33);
            uVar36 = uVar36 + 0x10;
          } while ((vin.n + 0xf & 0xfffffffffffffff0) != uVar36);
        }
      }
      else if ((uVar36 & 0xffff000000000000) == 0x2000000000000) {
        vin.ptr = local_77;
        vout.n = vin.n;
        vout.ptr = (float *)(local_77 + 3);
        sRGBColorEncoding::ToLinear((sRGBColorEncoding *)(uVar36 & 0xffffffffffff),vin,vout);
      }
      else {
        vin_00.n = vin.n;
        vin_00.ptr = local_77;
        vout_00.n = vin.n;
        vout_00.ptr = (float *)(local_77 + 3);
        GammaColorEncoding::ToLinear((GammaColorEncoding *)(uVar36 & 0xffffffffffff),vin_00,vout_00)
        ;
      }
      if (0 < (int)uVar34) {
        memcpy(result,local_77 + 3,(ulong)uVar34 << 2);
      }
    }
    if (uStack_68 != &uStack_58) {
      operator_delete(uStack_68,CONCAT71(uStack_57,uStack_58) + 1);
    }
  }
  return uVar34;
}

Assistant:

int PtexTextureBase::SampleTexture(TextureEvalContext ctx, float result[3]) const {
    if (!valid) {
        result[0] = 0.;
        return 1;
    }

    ++nLookups;
    Ptex::String error;
    Ptex::PtexTexture *texture = cache->get(filename.c_str(), error);
    CHECK(texture != nullptr);
    // TODO: make the filter an option?
    Ptex::PtexFilter::Options opts(Ptex::PtexFilter::FilterType::f_bspline);
    Ptex::PtexFilter *filter = Ptex::PtexFilter::getFilter(texture, opts);
    int nc = texture->numChannels();

    int firstChan = 0;
    filter->eval(result, firstChan, nc, ctx.faceIndex, ctx.uv[0], ctx.uv[1], ctx.dudx,
                 ctx.dvdx, ctx.dudy, ctx.dvdy);
    filter->release();
    texture->release();

    if (encoding != ColorEncodingHandle::Linear) {
        // It feels a little dirty to convert to 8-bits to run through the
        // encoding, but it's probably fine.
        uint8_t result8[3];
        for (int i = 0; i < nc; ++i)
            result8[i] = uint8_t(Clamp(result[i] * 255.f + 0.5f, 0, 255));

        // Handle Float == double.
        Float fResult[3];
        encoding.ToLinear(pstd::MakeConstSpan(result8, nc), pstd::MakeSpan(fResult, nc));
        for (int c = 0; c < nc; ++c)
            result[c] = fResult[c];
    }

    return nc;
}